

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  unsigned_long uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  element_type *this_00;
  ulong uVar7;
  undefined4 extraout_var;
  atomic<bool> *paVar8;
  char *__addr_len;
  element_type *peVar9;
  element_type *this_01;
  element_type *peVar10;
  unsigned_long uVar11;
  req_msg *in_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar13;
  iterator entry;
  ulong next_idx_for_resp;
  ptr<resp_msg> *resp;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdc0;
  atomic<bool> *in_stack_fffffffffffffdc8;
  msg_type *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffdf8;
  srv_role _role;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  int32 local_c0;
  undefined4 local_bc;
  ulong local_b8;
  undefined1 local_a9;
  undefined1 local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_48;
  int32 local_3c;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_38;
  unsigned_long local_30;
  req_msg *local_28;
  
  _role = (srv_role)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_30 = 0;
  local_28 = in_RDX;
  local_3c = msg_base::get_src(&in_RDX->super_msg_base);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::find(in_stack_fffffffffffffdb8,(key_type *)0x23bd67);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end(in_stack_fffffffffffffdb8);
  bVar2 = std::__detail::operator==(&local_38,&local_48);
  if (bVar2) {
    local_30 = std::numeric_limits<unsigned_long>::max();
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar2) {
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23bde4);
    iVar4 = (*peVar9->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x23be0a);
      std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x23be26);
      srv_role_to_string_abi_cxx11_(_role);
      uVar5 = std::__cxx11::string::c_str();
      uVar3 = msg_base::get_src(&local_28->super_msg_base);
      uVar6 = req_msg::get_last_log_term(local_28);
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23be93);
      (*peVar10->_vptr_log_store[4])(local_a8);
      this_00 = std::
                __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23beb6);
      uVar7 = log_entry::get_term(this_00);
      in_stack_fffffffffffffdb8 =
           (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
            *)req_msg::get_last_log_idx(local_28);
      peVar10 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23bef3);
      iVar4 = (*peVar10->_vptr_log_store[2])();
      in_stack_fffffffffffffdc0 = (int *)(CONCAT44(extraout_var,iVar4) + -1);
      paVar8 = (atomic<bool> *)msg_base::get_term(&local_28->super_msg_base);
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x23bf47);
      in_stack_fffffffffffffdd0 = (msg_type *)srv_state::get_term((srv_state *)0x23bf4f);
      bVar2 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdd8 = "HB dead";
      if (bVar2) {
        in_stack_fffffffffffffdd8 = "HB alive";
      }
      msg_if_given_abi_cxx11_
                ((char *)local_68,
                 "[PRE-VOTE REQ] my role %s, from peer %d, log term: req %lu / mine %lu\nlast idx: req %lu / mine %lu, term: req %lu / mine %lu\n%s"
                 ,uVar5,(ulong)uVar3,uVar6,uVar7);
      (*peVar9->_vptr_logger[8])
                (peVar9,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_prevote_req",0x19d,local_68);
      std::__cxx11::string::~string(local_68);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x23c040);
      std::__cxx11::string::~string(local_88);
      in_stack_fffffffffffffdc8 = paVar8;
    }
  }
  local_a9 = 0;
  local_b8 = msg_base::get_term(&local_28->super_msg_base);
  local_bc = 0x15;
  __addr_len = (char *)(in_RSI + 0x38);
  local_c0 = msg_base::get_src(&local_28->super_msg_base);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long&>
            ((unsigned_long *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             (int *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             (unsigned_long *)in_stack_fffffffffffffdb8);
  bVar2 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffdc8);
  if ((bVar2) &&
     (bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318)), bVar2)) {
    peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23c191);
    iVar4 = (*peVar9->_vptr_logger[7])();
    if (3 < iVar4) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x23c1ca);
      msg_if_given_abi_cxx11_((char *)local_e0,"this server is catching up, always accept pre-vote")
      ;
      __addr_len = "handle_prevote_req";
      (*peVar9->_vptr_logger[8])
                (peVar9,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_prevote_req",0x1ad,local_e0);
      std::__cxx11::string::~string(local_e0);
    }
  }
  bVar2 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffdc8);
  if ((!bVar2) ||
     (bVar2 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffdc8), uVar1 = local_30, bVar2
     )) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar2) {
      peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x23c2d0);
      iVar4 = (*peVar9->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23c303);
        msg_if_given_abi_cxx11_((char *)local_100,"pre-vote decision: O (grant)");
        __addr_len = "handle_prevote_req";
        (*peVar9->_vptr_logger[8])
                  (peVar9,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_req",0x1b0,local_100);
        std::__cxx11::string::~string(local_100);
      }
    }
    this_01 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x23c393);
    peVar10 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x23c3ac);
    iVar4 = (*peVar10->_vptr_log_store[2])();
    resp_msg::accept(this_01,iVar4,__addr,(socklen_t *)__addr_len);
    _Var12._M_pi = extraout_RDX;
  }
  else {
    uVar11 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 == uVar11) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      _Var12._M_pi = extraout_RDX_03;
      if (bVar2) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23c515);
        iVar4 = (*peVar9->_vptr_logger[7])();
        _Var12._M_pi = extraout_RDX_04;
        if (3 < iVar4) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23c548);
          msg_if_given_abi_cxx11_
                    ((char *)local_140,"pre-vote decision: XX (strong deny, non-existing node)");
          (*peVar9->_vptr_logger[8])
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_req",0x1b6,local_140);
          std::__cxx11::string::~string(local_140);
          _Var12._M_pi = extraout_RDX_05;
        }
      }
    }
    else {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      _Var12._M_pi = extraout_RDX_00;
      if (bVar2) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23c429);
        iVar4 = (*peVar9->_vptr_logger[7])();
        _Var12._M_pi = extraout_RDX_01;
        if (3 < iVar4) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23c45c);
          msg_if_given_abi_cxx11_((char *)local_120,"pre-vote decision: X (deny)");
          (*peVar9->_vptr_logger[8])
                    (peVar9,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_req",0x1b4,local_120);
          std::__cxx11::string::~string(local_120);
          _Var12._M_pi = extraout_RDX_02;
        }
      }
    }
  }
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req) {
    ulong next_idx_for_resp = 0;
    auto entry = peers_.find(req.get_src());
    if (entry == peers_.end()) {
        // This node already has been removed, set a special value.
        next_idx_for_resp = std::numeric_limits<ulong>::max();
    }

    p_in("[PRE-VOTE REQ] my role %s, from peer %d, "
         "log term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "last idx: req %" PRIu64 " / mine %" PRIu64
         ", term: req %" PRIu64 " / mine %" PRIu64 "\n"
         "%s",
         srv_role_to_string(role_).c_str(),
         req.get_src(), req.get_last_log_term(),
         log_store_->last_entry()->get_term(),
         req.get_last_log_idx(), log_store_->next_slot()-1,
         req.get_term(), state_->get_term(),
         (hb_alive_) ? "HB alive" : "HB dead");

    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::pre_vote_response,
            id_,
            req.get_src(),
            next_idx_for_resp ) );

    // NOTE:
    //   While `catching_up_` flag is on, this server does not get
    //   normal append_entries request so that `hb_alive_` may not
    //   be cleared properly. Hence, it should accept any pre-vote
    //   requests.
    if (catching_up_) {
        p_in("this server is catching up, always accept pre-vote");
    }
    if (!hb_alive_ || catching_up_) {
        p_in("pre-vote decision: O (grant)");
        resp->accept(log_store_->next_slot());
    } else {
        if (next_idx_for_resp != std::numeric_limits<ulong>::max()) {
            p_in("pre-vote decision: X (deny)");
        } else {
            p_in("pre-vote decision: XX (strong deny, non-existing node)");
        }
    }

    return resp;
}